

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

ZNode * new_ZNode(Parser *p,PNode *pn)

{
  ZNode *local_20;
  ZNode *z;
  PNode *pn_local;
  Parser *p_local;
  
  local_20 = p->free_znodes;
  if (local_20 == (ZNode *)0x0) {
    local_20 = (ZNode *)malloc(0x30);
  }
  else {
    p->free_znodes = (ZNode *)local_20->pn;
  }
  local_20->pn = pn;
  pn->refcount = pn->refcount + 1;
  (local_20->sns).n = 0;
  (local_20->sns).v = (SNode **)0x0;
  return local_20;
}

Assistant:

static ZNode *new_ZNode(Parser *p, PNode *pn) {
  ZNode *z = p->free_znodes;
  if (!z)
    z = MALLOC(sizeof *z);
  else
    p->free_znodes = znode_next(z);
  z->pn = pn;
  ref_pn(pn);
  vec_clear(&z->sns);
  return z;
}